

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::value(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *__return_storage_ptr__,
       SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this)

{
  double a;
  SPxSense SVar1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  cpp_dec_float<100U,_int,_void> *v;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> vv;
  long local_220;
  cpp_dec_float<100U,_int,_void> local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_120;
  cpp_dec_float<100U,_int,_void> local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  local_218.fpclass = cpp_dec_float_finite;
  local_218.prec_elem = 0x10;
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0;
  local_218.data._M_elems[2] = 0;
  local_218.data._M_elems[3] = 0;
  local_218.data._M_elems[4] = 0;
  local_218.data._M_elems[5] = 0;
  local_218.data._M_elems[6] = 0;
  local_218.data._M_elems[7] = 0;
  local_218.data._M_elems[8] = 0;
  local_218.data._M_elems[9] = 0;
  local_218.data._M_elems[10] = 0;
  local_218.data._M_elems[0xb] = 0;
  local_218.data._M_elems[0xc] = 0;
  local_218.data._M_elems[0xd] = 0;
  local_218.data._M_elems._56_5_ = 0;
  local_218.data._M_elems[0xf]._1_3_ = 0;
  local_218.exp = 0;
  local_218.neg = false;
  if (this->initialized == false) {
    ::soplex::infinity::__tls_init();
    a = *(double *)(in_FS_OFFSET + -8);
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x10;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,a);
    return __return_storage_ptr__;
  }
  if (this->theRep == ROW) {
    if (this->theType == LEAVE) {
      SVar1 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesense;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_1c8,
                  &this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,this->theFrhs);
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 0x10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems[6] = 0;
      local_178.data._M_elems[7] = 0;
      local_178.data._M_elems[8] = 0;
      local_178.data._M_elems[9] = 0;
      local_178.data._M_elems[10] = 0;
      local_178.data._M_elems[0xb] = 0;
      local_178.data._M_elems[0xc] = 0;
      local_178.data._M_elems[0xd] = 0;
      local_178.data._M_elems._56_5_ = 0;
      local_178.data._M_elems[0xf]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_120,(long)SVar1,(type *)0x0);
      local_178.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
      local_178.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
      local_178.data._M_elems._56_5_ = local_1c8.data._M_elems._56_5_;
      local_178.data._M_elems[0xf]._1_3_ = local_1c8.data._M_elems[0xf]._1_3_;
      local_178.data._M_elems[8] = local_1c8.data._M_elems[8];
      local_178.data._M_elems[9] = local_1c8.data._M_elems[9];
      local_178.data._M_elems[10] = local_1c8.data._M_elems[10];
      local_178.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
      local_178.data._M_elems[4] = local_1c8.data._M_elems[4];
      local_178.data._M_elems[5] = local_1c8.data._M_elems[5];
      local_178.data._M_elems[6] = local_1c8.data._M_elems[6];
      local_178.data._M_elems[7] = local_1c8.data._M_elems[7];
      local_178.data._M_elems[0] = local_1c8.data._M_elems[0];
      local_178.data._M_elems[1] = local_1c8.data._M_elems[1];
      local_178.data._M_elems[2] = local_1c8.data._M_elems[2];
      local_178.data._M_elems[3] = local_1c8.data._M_elems[3];
      local_178.exp = local_1c8.exp;
      local_178.neg = local_1c8.neg;
      local_178.fpclass = local_1c8.fpclass;
      local_178.prec_elem = local_1c8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_178,&local_120);
      goto LAB_00393287;
    }
    SVar1 = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesense;
    nonbasicValue(&local_80,this);
    vec = this->theFrhs;
    this_00 = this->theCoPvec;
  }
  else {
    SVar1 = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesense;
    nonbasicValue(&local_80,this);
    this_00 = this->theFvec;
    vec = this->theCoPrhs;
  }
  local_220 = (long)SVar1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator*((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_d0,
              &this_00->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,vec);
  local_1c8.data._M_elems[0] = local_80.m_backend.data._M_elems[0];
  local_1c8.data._M_elems[1] = local_80.m_backend.data._M_elems[1];
  local_1c8.data._M_elems[2] = local_80.m_backend.data._M_elems[2];
  local_1c8.data._M_elems[3] = local_80.m_backend.data._M_elems[3];
  local_1c8.data._M_elems[4] = local_80.m_backend.data._M_elems[4];
  local_1c8.data._M_elems[5] = local_80.m_backend.data._M_elems[5];
  local_1c8.data._M_elems[6] = local_80.m_backend.data._M_elems[6];
  local_1c8.data._M_elems[7] = local_80.m_backend.data._M_elems[7];
  local_1c8.data._M_elems[8] = local_80.m_backend.data._M_elems[8];
  local_1c8.data._M_elems[9] = local_80.m_backend.data._M_elems[9];
  local_1c8.data._M_elems[10] = local_80.m_backend.data._M_elems[10];
  local_1c8.data._M_elems[0xb] = local_80.m_backend.data._M_elems[0xb];
  local_1c8.data._M_elems[0xc] = local_80.m_backend.data._M_elems[0xc];
  local_1c8.data._M_elems[0xd] = local_80.m_backend.data._M_elems[0xd];
  local_1c8.data._M_elems[0xe] = local_80.m_backend.data._M_elems[0xe];
  local_1c8.data._M_elems[0xf] = local_80.m_backend.data._M_elems[0xf];
  local_1c8.exp = local_80.m_backend.exp;
  local_1c8.neg = local_80.m_backend.neg;
  local_1c8.fpclass = local_80.m_backend.fpclass;
  local_1c8.prec_elem = local_80.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(&local_1c8,&local_d0);
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 0x10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems[6] = 0;
  local_178.data._M_elems[7] = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.data._M_elems[10] = 0;
  local_178.data._M_elems[0xb] = 0;
  local_178.data._M_elems[0xc] = 0;
  local_178.data._M_elems[0xd] = 0;
  local_178.data._M_elems._56_5_ = 0;
  local_178.data._M_elems[0xf]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_120,local_220,(type *)0x0);
  local_178.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
  local_178.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
  local_178.data._M_elems._56_5_ = local_1c8.data._M_elems._56_5_;
  local_178.data._M_elems[0xf]._1_3_ = local_1c8.data._M_elems[0xf]._1_3_;
  local_178.data._M_elems[8] = local_1c8.data._M_elems[8];
  local_178.data._M_elems[9] = local_1c8.data._M_elems[9];
  local_178.data._M_elems[10] = local_1c8.data._M_elems[10];
  local_178.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
  local_178.data._M_elems[4] = local_1c8.data._M_elems[4];
  local_178.data._M_elems[5] = local_1c8.data._M_elems[5];
  local_178.data._M_elems[6] = local_1c8.data._M_elems[6];
  local_178.data._M_elems[7] = local_1c8.data._M_elems[7];
  local_178.data._M_elems[0] = local_1c8.data._M_elems[0];
  local_178.data._M_elems[1] = local_1c8.data._M_elems[1];
  local_178.data._M_elems[2] = local_1c8.data._M_elems[2];
  local_178.data._M_elems[3] = local_1c8.data._M_elems[3];
  local_178.exp = local_1c8.exp;
  local_178.neg = local_1c8.neg;
  local_178.fpclass = local_1c8.fpclass;
  local_178.prec_elem = local_1c8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_178,&local_120)
  ;
LAB_00393287:
  local_218.fpclass = local_178.fpclass;
  local_218.prec_elem = local_178.prec_elem;
  v = &(this->
       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).offset.m_backend;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  if (v == &__return_storage_ptr__->m_backend) {
    v = &local_218;
  }
  else if (&local_218 != &__return_storage_ptr__->m_backend) {
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
         local_178.data._M_elems._48_8_;
    *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_178.data._M_elems[0xf]._1_3_,local_178.data._M_elems._56_5_);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         local_178.data._M_elems._32_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
         local_178.data._M_elems._40_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_178.data._M_elems._16_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         local_178.data._M_elems._24_8_;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_178.data._M_elems._0_8_
    ;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_178.data._M_elems._8_8_;
    (__return_storage_ptr__->m_backend).exp = local_178.exp;
    (__return_storage_ptr__->m_backend).neg = local_178.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_178.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_178.prec_elem;
  }
  local_218.data._M_elems._0_8_ = local_178.data._M_elems._0_8_;
  local_218.data._M_elems._8_8_ = local_178.data._M_elems._8_8_;
  local_218.data._M_elems._16_8_ = local_178.data._M_elems._16_8_;
  local_218.data._M_elems._24_8_ = local_178.data._M_elems._24_8_;
  local_218.data._M_elems._32_8_ = local_178.data._M_elems._32_8_;
  local_218.data._M_elems._40_8_ = local_178.data._M_elems._40_8_;
  local_218.data._M_elems._48_8_ = local_178.data._M_elems._48_8_;
  local_218.data._M_elems._56_5_ = local_178.data._M_elems._56_5_;
  local_218.data._M_elems[0xf]._1_3_ = local_178.data._M_elems[0xf]._1_3_;
  local_218.exp = local_178.exp;
  local_218.neg = local_178.neg;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&__return_storage_ptr__->m_backend,v);
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::value()
   {
      assert(isInitialized());

      R x;

      // calling value() without having a suitable status is an error.
      if(!isInitialized())
         return R(infinity);

      if(rep() == ROW)
      {
         if(type() == LEAVE)
            x = int(SPxLPBase<R>::spxSense()) * (coPvec() *
                                                 fRhs()); // the contribution of maxRowObj() is missing
         else
            x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + (coPvec() * fRhs()));
      }
      else
         x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + fVec() * coPrhs());

      return x + this->objOffset();
   }